

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

void __thiscall ZAP::Archive::~Archive(Archive *this)

{
  int in_ESI;
  Archive *this_local;
  
  close(this,in_ESI);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>_>_>
  ::~unordered_map(&this->lookupTable);
  return;
}

Assistant:

Archive::~Archive()
	{
		close();
	}